

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_filter.cpp
# Opt level: O3

string * __thiscall
cppcms::copy_filter::detach_abi_cxx11_(string *__return_storage_ptr__,copy_filter *this)

{
  ostream *poVar1;
  long lVar2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar3;
  _List_node_base *p_Var4;
  
  std::ostream::flush();
  booster::streambuf::reset_device();
  this->detached_ = true;
  poVar1 = this->output_;
  lVar2 = *(long *)(*(long *)poVar1 + -0x18);
  std::ios::rdbuf((streambuf *)
                  (&this->real_output_stream_ +
                  *(long *)(*(long *)&this->real_output_stream_ + -0x18)));
  std::ios::rdbuf((streambuf *)(poVar1 + lVar2));
  plVar3 = &this->data_;
  for (p_Var4 = (this->data_).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next; p_Var4 != (_List_node_base *)plVar3;
      p_Var4 = p_Var4->_M_next) {
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  p_Var4 = (_List_node_base *)plVar3;
  while (p_Var4 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar3) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var4[1]._M_next);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string copy_filter::detach()
	{
		output_ << std::flush;
		copy_buffer_.reset_device();
		detached_ = true;
		output_.rdbuf(real_output_stream_.rdbuf(0));
		size_t len = 0;
		std::list<std::string>::iterator p;
		for(p=data_.begin();p!=data_.end();p++)
			len+=p->size();
		std::string result;
		result.reserve(len);
		for(p=data_.begin();p!=data_.end();p++)
			result+=*p;
		return result;
	}